

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O1

BOOL __thiscall
Js::ES5ArrayTypeHandlerBase<unsigned_short>::SetWritable
          (ES5ArrayTypeHandlerBase<unsigned_short> *this,DynamicObject *instance,
          PropertyId propertyId,BOOL value)

{
  JavascriptLibrary *pJVar1;
  BOOL BVar2;
  uint uVar3;
  PrototypeChainCache<Js::OnlyWritablePropertyCache> *local_40;
  int local_34 [2];
  BOOL isNumericPropertyId;
  
  if (propertyId == 0xd1) {
    uVar3 = 1;
    this->lengthWritable = value != 0;
    if (value == 0) {
      DynamicTypeHandler::SetHasOnlyWritableDataProperties((DynamicTypeHandler *)this,false);
      if (((this->super_DictionaryTypeHandlerBase<unsigned_short>).super_DynamicTypeHandler.flags &
          0x20) != 0) {
        pJVar1 = (((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
        Memory::Recycler::WBSetBit((char *)&local_40);
        local_40 = &pJVar1->typesWithOnlyWritablePropertyProtoChain;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_40);
        PrototypeChainCache<Js::OnlyWritablePropertyCache>::Clear(local_40);
      }
    }
  }
  else {
    BVar2 = UpdateAttribute(this,instance,propertyId,'\x04',value,local_34);
    uVar3 = 1;
    if ((BVar2 == 0) && (uVar3 = 0, local_34[0] == 0)) {
      BVar2 = DictionaryTypeHandlerBase<unsigned_short>::SetWritable
                        (&this->super_DictionaryTypeHandlerBase<unsigned_short>,instance,propertyId,
                         value);
      uVar3 = (uint)(BVar2 != 0);
    }
  }
  return uVar3;
}

Assistant:

BOOL ES5ArrayTypeHandlerBase<T>::SetWritable(DynamicObject* instance, PropertyId propertyId, BOOL value)
    {
        if (propertyId == PropertyIds::length)
        {
            SetLengthWritable(value ? true : false);
            if(!value && this->GetFlags() & this->IsPrototypeFlag)
            {
                instance->GetLibrary()->GetTypesWithOnlyWritablePropertyProtoChainCache()->Clear();
            }
            return true;
        }

        BOOL isNumericPropertyId;
        return UpdateAttribute(instance, propertyId, PropertyWritable, value, isNumericPropertyId)
            || (!isNumericPropertyId && __super::SetWritable(instance, propertyId, value));
    }